

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int xmlCheckCdataPush(xmlChar *utf,int len,int complete)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  iVar3 = 0;
  if (0 < len && utf != (xmlChar *)0x0) {
    iVar3 = 0;
    do {
      bVar1 = utf[iVar3];
      uVar5 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        if ((uVar5 & 0xffffffe0) == 0xc0) {
          iVar2 = iVar3 + 2;
          if (len < iVar2) {
LAB_00169e59:
            if (complete != 0) {
              return -iVar3;
            }
            return iVar3;
          }
          if ((utf[(long)iVar3 + 1] & 0xffffffc0) != 0x80) goto LAB_00169e53;
          uVar4 = (uVar5 & 0x1f) << 6;
          if (uVar4 < 0x100) {
            uVar4 = utf[(long)iVar3 + 1] & 0x3f | uVar4;
LAB_00169df7:
            if ((uVar4 < 0x20) && ((0xd < uVar4 || ((0x2600U >> (uVar4 & 0x1f) & 1) == 0)))) {
LAB_00169e53:
              return -iVar3;
            }
          }
        }
        else if ((uVar5 & 0xfffffff0) == 0xe0) {
          iVar2 = iVar3 + 3;
          if (len < iVar2) goto LAB_00169e59;
          if (((utf[(long)iVar3 + 1] & 0xc0) != 0x80) || ((utf[(long)iVar3 + 2] & 0xc0) != 0x80))
          goto LAB_00169e53;
          uVar5 = (uVar5 & 0xf) << 0xc;
          uVar6 = (utf[(long)iVar3 + 1] & 0x3f) << 6 | uVar5;
          uVar4 = utf[(long)iVar3 + 2] & 0x3f | uVar6;
          if (uVar6 < 0x100) goto LAB_00169df7;
          if ((0xd7ff < uVar6) && ((uVar5 < 0xe000 || (0xfffd < uVar4)))) goto LAB_00169e53;
        }
        else {
          if ((uVar5 & 0xfffffff8) != 0xf0) goto LAB_00169e53;
          iVar2 = iVar3 + 4;
          if (len < iVar2) goto LAB_00169e59;
          if ((((utf[(long)iVar3 + 1] & 0xc0) != 0x80) ||
              ((utf[(long)iVar3 + 2] & 0xffffffc0) != 0x80)) ||
             ((utf[(long)iVar3 + 3] & 0xc0) != 0x80)) goto LAB_00169e53;
          uVar6 = (utf[(long)iVar3 + 1] & 0x3f) << 0xc | (uVar5 & 7) << 0x12;
          uVar5 = (utf[(long)iVar3 + 2] & 0x3f) << 6 | uVar6;
          uVar4 = utf[(long)iVar3 + 3] & 0x3f | uVar5;
          if (uVar5 < 0x100) goto LAB_00169df7;
          if ((0xd7ff < uVar5) && (0xfffff < uVar6 - 0x10000 && (0xfffd < uVar4 || uVar6 < 0xe000)))
          goto LAB_00169e53;
        }
      }
      else {
        if ((bVar1 < 0x20) && ((0xd < uVar5 || ((0x2600U >> (uVar5 & 0x1f) & 1) == 0))))
        goto LAB_00169e53;
        iVar2 = iVar3 + 1;
      }
      iVar3 = iVar2;
    } while (iVar3 < len);
  }
  return iVar3;
}

Assistant:

static int
xmlCheckCdataPush(const xmlChar *utf, int len, int complete) {
    int ix;
    unsigned char c;
    int codepoint;

    if ((utf == NULL) || (len <= 0))
        return(0);

    for (ix = 0; ix < len;) {      /* string is 0-terminated */
        c = utf[ix];
        if ((c & 0x80) == 0x00) {	/* 1-byte code, starts with 10 */
	    if (c >= 0x20)
		ix++;
	    else if ((c == 0xA) || (c == 0xD) || (c == 0x9))
	        ix++;
	    else
	        return(-ix);
	} else if ((c & 0xe0) == 0xc0) {/* 2-byte code, starts with 110 */
	    if (ix + 2 > len) return(complete ? -ix : ix);
	    if ((utf[ix+1] & 0xc0 ) != 0x80)
	        return(-ix);
	    codepoint = (utf[ix] & 0x1f) << 6;
	    codepoint |= utf[ix+1] & 0x3f;
	    if (!xmlIsCharQ(codepoint))
	        return(-ix);
	    ix += 2;
	} else if ((c & 0xf0) == 0xe0) {/* 3-byte code, starts with 1110 */
	    if (ix + 3 > len) return(complete ? -ix : ix);
	    if (((utf[ix+1] & 0xc0) != 0x80) ||
	        ((utf[ix+2] & 0xc0) != 0x80))
		    return(-ix);
	    codepoint = (utf[ix] & 0xf) << 12;
	    codepoint |= (utf[ix+1] & 0x3f) << 6;
	    codepoint |= utf[ix+2] & 0x3f;
	    if (!xmlIsCharQ(codepoint))
	        return(-ix);
	    ix += 3;
	} else if ((c & 0xf8) == 0xf0) {/* 4-byte code, starts with 11110 */
	    if (ix + 4 > len) return(complete ? -ix : ix);
	    if (((utf[ix+1] & 0xc0) != 0x80) ||
	        ((utf[ix+2] & 0xc0) != 0x80) ||
		((utf[ix+3] & 0xc0) != 0x80))
		    return(-ix);
	    codepoint = (utf[ix] & 0x7) << 18;
	    codepoint |= (utf[ix+1] & 0x3f) << 12;
	    codepoint |= (utf[ix+2] & 0x3f) << 6;
	    codepoint |= utf[ix+3] & 0x3f;
	    if (!xmlIsCharQ(codepoint))
	        return(-ix);
	    ix += 4;
	} else				/* unknown encoding */
	    return(-ix);
      }
      return(ix);
}